

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# st_string.h
# Opt level: O3

ST_ssize_t __thiscall
ST::string::_find_last(string *this,size_t max,char *substr,size_t count,case_sensitivity_t cs)

{
  byte *pbVar1;
  byte bVar2;
  char cVar3;
  byte *pbVar4;
  ulong uVar5;
  int iVar6;
  byte *__s;
  byte bVar7;
  byte *pbVar8;
  char *ep;
  size_t sVar9;
  byte *pbVar10;
  byte bVar11;
  byte bVar12;
  byte *pbVar13;
  
  pbVar4 = (byte *)(this->m_buffer).m_chars;
  uVar5 = (this->m_buffer).m_size;
  if (uVar5 < max) {
    max = uVar5;
  }
  pbVar1 = pbVar4 + max;
  __s = pbVar4;
  pbVar10 = (byte *)0x0;
  while( true ) {
    pbVar13 = pbVar10;
    if (cs != case_sensitive) {
      bVar2 = *substr;
      bVar7 = bVar2 | 0x20;
      if (0x19 < (byte)(bVar2 + 0xbf)) {
        bVar7 = bVar2;
      }
      pbVar10 = pbVar1;
      if (pbVar1 != __s && -1 < (long)pbVar1 - (long)__s) {
        do {
          pbVar8 = pbVar4 + ((max - 1) - (long)__s);
          while( true ) {
            bVar2 = *__s;
            bVar11 = bVar2 | 0x20;
            if (0x19 < (byte)(bVar2 + 0xbf)) {
              bVar11 = bVar2;
            }
            if (bVar11 == bVar7) break;
            __s = __s + 1;
            pbVar8 = pbVar8 + -1;
            if (pbVar10 <= __s) goto LAB_0018ff0d;
          }
          if (pbVar1 < __s + count) break;
          sVar9 = 0;
          do {
            pbVar10 = __s;
            if (count == sVar9) goto LAB_0018fefa;
            bVar2 = __s[sVar9];
            bVar11 = bVar2 | 0x20;
            if (0x19 < (byte)(bVar2 + 0xbf)) {
              bVar11 = bVar2;
            }
            bVar2 = substr[sVar9];
            bVar12 = bVar2 | 0x20;
            if (0x19 < (byte)(bVar2 + 0xbf)) {
              bVar12 = bVar2;
            }
            sVar9 = sVar9 + 1;
          } while (bVar11 == bVar12);
          pbVar10 = __s + (long)(pbVar8 + 1);
          __s = __s + 1;
        } while (0 < (long)pbVar8);
      }
      break;
    }
    if (pbVar1 == __s) break;
    cVar3 = *substr;
    while( true ) {
      pbVar10 = (byte *)memchr(__s,(int)cVar3,(long)pbVar1 - (long)__s);
      if ((count == 0) || (pbVar1 < pbVar10 + count || pbVar10 == (byte *)0x0)) break;
      iVar6 = bcmp(pbVar10,substr,count);
      if (iVar6 == 0) goto LAB_0018fefa;
      __s = pbVar10 + 1;
      if (pbVar1 == __s) goto LAB_0018ff0d;
    }
    if (pbVar1 < pbVar10 + count || pbVar10 == (byte *)0x0) {
      pbVar10 = (byte *)0x0;
    }
LAB_0018fefa:
    if ((pbVar10 == (byte *)0x0) || (__s = pbVar10 + 1, pbVar1 <= pbVar10)) break;
  }
LAB_0018ff0d:
  return -(ulong)(pbVar13 == (byte *)0x0) | (long)pbVar13 - (long)pbVar4;
}

Assistant:

ST_NODISCARD
        ST_ssize_t _find_last(size_t max, const char *substr, size_t count,
                              case_sensitivity_t cs = case_sensitive) const noexcept
        {
            const char *endp = c_str() + (max > size() ? size() : max);

            const char *start = c_str();
            const char *found = nullptr;
            for ( ;; ) {
                const char *cp = (cs == case_sensitive)
                        ? _ST_PRIVATE::find_cs(start, endp - start, substr, count)
                        : _ST_PRIVATE::find_ci(start, endp - start, substr, count);
                if (!cp || cp >= endp)
                    break;
                found = cp;
                start = cp + 1;
            }
            return found ? (found - c_str()) : -1;
        }